

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::PlainSkipTemplatedInternal<duckdb::UUIDValueConversion,true,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t row_offset)

{
  ByteBuffer *plain_data_00;
  ByteBuffer *pBVar1;
  long in_RCX;
  long in_RDX;
  ColumnReader *in_RDI;
  ulong in_R8;
  idx_t row_idx;
  ColumnReader *in_stack_ffffffffffffffb8;
  undefined8 local_30;
  
  for (local_30 = in_R8; local_30 < in_R8 + in_RCX; local_30 = local_30 + 1) {
    plain_data_00 = (ByteBuffer *)(ulong)*(byte *)(in_RDX + local_30);
    pBVar1 = (ByteBuffer *)MaxDefine(in_RDI);
    if (plain_data_00 == pBVar1) {
      UUIDValueConversion::PlainSkip<true>(plain_data_00,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}